

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt_hc::update_progress
          (dxt_hc *this,uint phase_index,uint subphase_index,uint subphase_total)

{
  crn_progress_callback_func p_Var1;
  uint uVar2;
  crn_bool cVar3;
  byte bVar4;
  
  p_Var1 = (this->m_params).m_pProgress_func;
  bVar4 = 1;
  if (p_Var1 != (crn_progress_callback_func)0x0) {
    uVar2 = 100;
    if (1 < subphase_total) {
      uVar2 = (subphase_index * 100) / (subphase_total - 1);
    }
    if ((this->m_prev_phase_index == phase_index) && (this->m_prev_percentage_complete == uVar2)) {
      bVar4 = this->m_canceled ^ 1;
    }
    else {
      this->m_prev_percentage_complete = uVar2;
      cVar3 = (*p_Var1)(phase_index,0x19,subphase_index,subphase_total,
                        (this->m_params).m_pProgress_func_data);
      if (cVar3 == 0) {
        this->m_canceled = true;
        bVar4 = 0;
      }
    }
  }
  return (bool)bVar4;
}

Assistant:

bool dxt_hc::update_progress(uint phase_index, uint subphase_index, uint subphase_total)
    {
        CRNLIB_ASSERT(crn_get_current_thread_id() == m_main_thread_id);

        if (!m_params.m_pProgress_func)
        {
            return true;
        }

        const int percentage_complete = (subphase_total > 1) ? ((100 * subphase_index) / (subphase_total - 1)) : 100;
        if (((int)phase_index == m_prev_phase_index) && (m_prev_percentage_complete == percentage_complete))
        {
            return !m_canceled;
        }

        m_prev_percentage_complete = percentage_complete;

        bool status = (*m_params.m_pProgress_func)(phase_index, cTotalCompressionPhases, subphase_index, subphase_total, m_params.m_pProgress_func_data) != 0;
        if (!status)
        {
            m_canceled = true;
            return false;
        }

        return true;
    }